

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perror.c
# Opt level: O2

PError * p_error_new_literal(pint code,pint native_code,pchar *message)

{
  PError *pPVar1;
  pchar *ppVar2;
  
  pPVar1 = p_error_new();
  if (pPVar1 != (PError *)0x0) {
    pPVar1->code = code;
    pPVar1->native_code = native_code;
    ppVar2 = p_strdup(message);
    pPVar1->message = ppVar2;
  }
  return pPVar1;
}

Assistant:

P_LIB_API PError *
p_error_new_literal (pint		code,
		     pint		native_code,
		     const pchar	*message)
{
	PError *ret;

	if (P_UNLIKELY ((ret = p_error_new ()) == NULL))
		return NULL;

	ret->code        = code;
	ret->native_code = native_code;
	ret->message     = p_strdup (message);

	return ret;
}